

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O3

void ParseSpriteFrames(PClassActor *info,TArray<FState,_FState> *states,
                      TArray<FScriptPosition,_FScriptPosition> *SourceLines,FScanner *sc)

{
  uint8_t uVar1;
  uint uVar2;
  FState *pFVar3;
  bool bVar4;
  uint8_t uVar5;
  char *pcVar7;
  char *pcVar8;
  uint16_t uVar9;
  char *stop;
  long local_58;
  FScriptPosition local_48;
  char *local_38;
  char cVar6;
  
  pcVar7 = strtok(sc->String,",\t\n\r");
  if (pcVar7 == (char *)0x0) {
    return;
  }
  uVar1 = info->DefaultStateUsage;
  uVar5 = '\0';
  uVar9 = 0;
LAB_0053d753:
  pcVar7 = pcVar7 + -1;
  do {
    pcVar8 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while (*pcVar8 == ' ');
  pcVar8 = strchr(pcVar7,0x3a);
  if (pcVar8 == (char *)0x0) {
    local_58 = 4;
  }
  else {
    *pcVar8 = '\0';
    local_38 = pcVar8;
    local_58 = strtol(pcVar7,(char **)&local_48,10);
    if ((int)local_58 - 0xffffU < 0xffff0002 || pcVar7 == local_48.FileName.Chars) {
      FScanner::ScriptError(sc,"Rates must be in the range [0,65534]");
    }
    pcVar7 = local_38 + 1;
  }
  bVar4 = true;
  do {
    cVar6 = *pcVar7;
    if (cVar6 != ' ') {
      if (cVar6 == '*') {
        if (bVar4) {
          FScanner::ScriptError(sc,"* must come after a frame");
        }
        uVar9 = 4;
      }
      else {
        if (cVar6 == '\0') break;
        if ((byte)(cVar6 + 0xa2U) < 0xe3) {
          FScanner::ScriptError(sc,"Frames must be A-Z, [, \\, or ]");
        }
        else {
          if (!bVar4) {
            TArray<FState,_FState>::Grow(states,1);
            pFVar3 = states->Array;
            uVar2 = states->Count;
            pFVar3[uVar2].sprite = 0;
            pFVar3[uVar2].NextState = (FState *)0x0;
            pFVar3[uVar2].ActionFunc = (VMFunction *)0x0;
            pFVar3[uVar2].Tics = (int16_t)local_58;
            pFVar3[uVar2].TicRange = 0;
            pFVar3[uVar2].Light = 0;
            pFVar3[uVar2].StateFlags = uVar9;
            pFVar3[uVar2].Frame = uVar5;
            pFVar3[uVar2].UseFlags = uVar1;
            *(undefined8 *)&pFVar3[uVar2].DefineFlags = 0;
            *(undefined2 *)((long)&pFVar3[uVar2].Misc2 + 2) = 0;
            states->Count = states->Count + 1;
            FScriptPosition::FScriptPosition(&local_48,sc);
            TArray<FScriptPosition,_FScriptPosition>::Grow(SourceLines,1);
            FScriptPosition::FScriptPosition(SourceLines->Array + SourceLines->Count,&local_48);
            SourceLines->Count = SourceLines->Count + 1;
            FString::~FString(&local_48.FileName);
            cVar6 = *pcVar7;
          }
          uVar5 = cVar6 + 0xbf;
          bVar4 = false;
        }
      }
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
  if (!bVar4) {
    TArray<FState,_FState>::Grow(states,1);
    pFVar3 = states->Array;
    uVar2 = states->Count;
    pFVar3[uVar2].sprite = 0;
    pFVar3[uVar2].NextState = (FState *)0x0;
    pFVar3[uVar2].ActionFunc = (VMFunction *)0x0;
    pFVar3[uVar2].Tics = (int16_t)local_58;
    pFVar3[uVar2].TicRange = 0;
    pFVar3[uVar2].Light = 0;
    pFVar3[uVar2].StateFlags = uVar9;
    pFVar3[uVar2].Frame = uVar5;
    pFVar3[uVar2].UseFlags = uVar1;
    *(undefined8 *)&pFVar3[uVar2].DefineFlags = 0;
    *(undefined2 *)((long)&pFVar3[uVar2].Misc2 + 2) = 0;
    states->Count = states->Count + 1;
    FScriptPosition::FScriptPosition(&local_48,sc);
    TArray<FScriptPosition,_FScriptPosition>::Grow(SourceLines,1);
    FScriptPosition::FScriptPosition(SourceLines->Array + SourceLines->Count,&local_48);
    SourceLines->Count = SourceLines->Count + 1;
    FString::~FString(&local_48.FileName);
  }
  pcVar7 = strtok((char *)0x0,",\t\n\r");
  if (pcVar7 == (char *)0x0) {
    return;
  }
  goto LAB_0053d753;
}

Assistant:

static void ParseSpriteFrames (PClassActor *info, TArray<FState> &states, TArray<FScriptPosition> &SourceLines, FScanner &sc)
{
	FState state;
	char *token = strtok (sc.String, ",\t\n\r");

	memset (&state, 0, sizeof(state));
	state.UseFlags = info->DefaultStateUsage;

	while (token != NULL)
	{
		// Skip leading white space
		while (*token == ' ')
			token++;

		int rate = 4;
		bool firstState = true;
		char *colon = strchr (token, ':');

		if (colon != NULL)
		{
			char *stop;

			*colon = 0;
			rate = strtol (token, &stop, 10);
			if (stop == token || rate < 1 || rate > 65534)
			{
				sc.ScriptError ("Rates must be in the range [0,65534]");
			}
			token = colon + 1;
		}

		state.Tics = rate;
		state.TicRange = 0;

		while (*token)
		{
			if (*token == ' ')
			{
			}
			else if (*token == '*')
			{
				if (firstState)
				{
					sc.ScriptError ("* must come after a frame");
				}
				state.StateFlags |= STF_FULLBRIGHT;
			}
			else if (*token < 'A' || *token > ']')
			{
				sc.ScriptError ("Frames must be A-Z, [, \\, or ]");
			}
			else
			{
				if (!firstState)
				{
					states.Push (state);
					SourceLines.Push(sc);
				}
				firstState = false;
				state.Frame = *token-'A';	
			}
			++token;
		}
		if (!firstState)
		{
			states.Push (state);
			SourceLines.Push(sc);
		}

		token = strtok (NULL, ",\t\n\r");
	}
}